

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrixTriangular.h
# Opt level: O3

void __thiscall
Eigen::internal::tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1>::operator()
          (tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1> *this,ResScalar *res,
          long resStride,double *blockA,double *blockB,long size,long depth,ResScalar *alpha,
          double *workspace)

{
  long lVar1;
  ResScalar *pRVar2;
  ResScalar *pRVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long rows;
  ulong uVar8;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  Matrix<double,_4,_4,_0,_4,_4> buffer;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_109;
  ResScalar *local_108;
  ResScalar *local_100;
  long local_f8;
  long local_f0;
  double *local_e8;
  long local_e0;
  double *local_d8;
  long local_d0;
  double *local_c8;
  ulong local_c0;
  ResScalar local_b8 [17];
  
  if (0 < size) {
    local_f0 = resStride * 0x20 + 0x20;
    lVar5 = 0;
    lVar6 = size;
    local_108 = res;
    local_100 = res;
    local_f8 = resStride;
    local_e8 = blockA;
    local_e0 = size;
    local_d8 = blockB;
    do {
      uVar8 = 4;
      if (size < 4) {
        uVar8 = size;
      }
      if ((long)uVar8 < 2) {
        uVar8 = 1;
      }
      lVar7 = lVar6 - lVar5;
      rows = 4;
      if (lVar7 < 4) {
        rows = lVar7;
      }
      local_c8 = local_d8 + lVar5 * depth;
      local_b8[0xe] = 0.0;
      local_b8[0xf] = 0.0;
      local_b8[0xc] = 0.0;
      local_b8[0xd] = 0.0;
      local_b8[10] = 0.0;
      local_b8[0xb] = 0.0;
      local_b8[8] = 0.0;
      local_b8[9] = 0.0;
      local_b8[6] = 0.0;
      local_b8[7] = 0.0;
      local_b8[4] = 0.0;
      local_b8[5] = 0.0;
      local_b8[2] = 0.0;
      local_b8[3] = 0.0;
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_c0 = size;
      gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                (&local_109,local_b8,4,blockA + lVar5 * depth,local_c8,rows,depth,rows,*alpha,-1,-1,
                 0,0,workspace);
      lVar6 = local_e0;
      blockA = local_e8;
      if (0 < lVar7) {
        pRVar2 = local_b8;
        uVar4 = 0;
        pRVar3 = local_108;
        do {
          lVar7 = 0;
          do {
            if (3 < (uVar4 + lVar7 | uVar4)) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0x151,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 4, 4>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, 4, 4>, Level = 1]"
                           );
            }
            pRVar3[lVar7] = pRVar2[lVar7] + pRVar3[lVar7];
            lVar1 = uVar4 + lVar7;
            lVar7 = lVar7 + 1;
          } while (lVar1 + 1 < rows);
          uVar4 = uVar4 + 1;
          pRVar3 = pRVar3 + resStride + 1;
          pRVar2 = pRVar2 + 5;
        } while (uVar4 != uVar8);
      }
      lVar7 = rows + lVar5;
      local_d0 = lVar5;
      gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                (&local_109,local_100 + lVar5 * local_f8 + lVar7,local_f8,local_e8 + lVar7 * depth,
                 local_c8,local_e0 - lVar7,depth,rows,*alpha,-1,-1,0,0,workspace);
      lVar5 = local_d0 + 4;
      size = local_c0 - 4;
      local_108 = (ResScalar *)((long)local_108 + local_f0);
    } while (lVar5 < lVar6);
  }
  return;
}

Assistant:

void operator()(ResScalar* res, Index resStride, const LhsScalar* blockA, const RhsScalar* blockB, Index size, Index depth, const ResScalar& alpha, RhsScalar* workspace)
  {
    gebp_kernel<LhsScalar, RhsScalar, Index, mr, nr, ConjLhs, ConjRhs> gebp_kernel;
    Matrix<ResScalar,BlockSize,BlockSize,ColMajor> buffer;

    // let's process the block per panel of actual_mc x BlockSize,
    // again, each is split into three parts, etc.
    for (Index j=0; j<size; j+=BlockSize)
    {
      Index actualBlockSize = std::min<Index>(BlockSize,size - j);
      const RhsScalar* actual_b = blockB+j*depth;

      if(UpLo==Upper)
        gebp_kernel(res+j*resStride, resStride, blockA, actual_b, j, depth, actualBlockSize, alpha,
                    -1, -1, 0, 0, workspace);

      // selfadjoint micro block
      {
        Index i = j;
        buffer.setZero();
        // 1 - apply the kernel on the temporary buffer
        gebp_kernel(buffer.data(), BlockSize, blockA+depth*i, actual_b, actualBlockSize, depth, actualBlockSize, alpha,
                    -1, -1, 0, 0, workspace);
        // 2 - triangular accumulation
        for(Index j1=0; j1<actualBlockSize; ++j1)
        {
          ResScalar* r = res + (j+j1)*resStride + i;
          for(Index i1=UpLo==Lower ? j1 : 0;
              UpLo==Lower ? i1<actualBlockSize : i1<=j1; ++i1)
            r[i1] += buffer(i1,j1);
        }
      }

      if(UpLo==Lower)
      {
        Index i = j+actualBlockSize;
        gebp_kernel(res+j*resStride+i, resStride, blockA+depth*i, actual_b, size-i, depth, actualBlockSize, alpha,
                    -1, -1, 0, 0, workspace);
      }
    }
  }